

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O1

int cuddZddSwapping(DdManager *table,int lower,int upper,Cudd_ReorderingType heuristic)

{
  DdHalfWord DVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint *puVar6;
  long lVar7;
  ulong uVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  int iVar13;
  uint uVar14;
  DdHalfWord DVar15;
  DdHalfWord x;
  DdHalfWord DVar16;
  DdHalfWord DVar17;
  DdHalfWord DVar18;
  DdHalfWord DVar19;
  bool bVar20;
  DdHalfWord local_a4;
  uint local_84;
  
  iVar13 = upper - lower;
  if (iVar13 < 0) {
    return 1;
  }
  DVar16 = 0xffffffff;
  iVar2 = 0;
LAB_00810174:
  if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
    if (lower <= upper) {
      puVar6 = &table->subtableZ[lower].keys;
      uVar14 = 0xffffffff;
      DVar17 = lower;
      do {
        if ((int)uVar14 < (int)*puVar6) {
          DVar16 = DVar17;
          uVar14 = *puVar6;
        }
        puVar6 = puVar6 + 0xe;
        DVar17 = DVar17 + 1;
      } while (upper + 1U != DVar17);
    }
    DVar17 = DVar16;
    if (upper - DVar16 != 0) {
      lVar7 = Cudd_Random();
      DVar17 = DVar16 + (int)(lVar7 % (long)(int)(upper - DVar16)) + 1;
    }
    DVar15 = lower;
    if (0 < (int)(DVar16 + ~lower)) {
      do {
        uVar8 = Cudd_Random();
        DVar15 = (DdHalfWord)
                 ((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) %
                 (long)(int)(DVar16 + ~lower));
      } while (DVar15 == DVar17);
    }
  }
  else {
    lVar7 = Cudd_Random();
    lVar7 = lVar7 % (long)(ulong)(iVar13 + 1);
    do {
      lVar5 = Cudd_Random();
      lVar5 = lVar5 % (long)(ulong)(iVar13 + 1);
    } while (lVar7 == lVar5);
    DVar17 = (int)lVar5 + lower;
    DVar15 = (int)lVar7 + lower;
  }
  DVar1 = DVar17;
  if ((int)DVar17 < (int)DVar15) {
    DVar1 = DVar15;
  }
  uVar14 = table->keysZ;
  if ((int)DVar15 < (int)DVar17) {
    DVar17 = DVar15;
  }
  x = DVar1 - 1;
  pDVar11 = (DdNode *)0x0;
  DVar15 = DVar17;
  local_a4 = DVar1;
  local_84 = uVar14;
  do {
    DVar18 = DVar15 + 1;
    pDVar12 = pDVar11;
    if (DVar18 == x) {
      iVar3 = cuddZddSwapInPlace(table,DVar15,DVar18);
      if ((iVar3 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0))
      goto LAB_008104ba;
      pDVar9->index = DVar15;
      pDVar9->ref = DVar18;
      *(int *)((long)&pDVar9->next + 4) = iVar3;
      (pDVar9->type).kids.T = pDVar11;
      iVar3 = cuddZddSwapInPlace(table,x,local_a4);
      pDVar12 = pDVar9;
      if ((iVar3 == 0) || (pDVar10 = cuddDynamicAllocNode(table), pDVar10 == (DdNode *)0x0))
      goto LAB_008104ba;
      pDVar10->index = x;
      pDVar10->ref = local_a4;
      *(int *)((long)&pDVar10->next + 4) = iVar3;
      (pDVar10->type).kids.T = pDVar9;
      uVar4 = cuddZddSwapInPlace(table,DVar15,DVar18);
      pDVar12 = pDVar10;
      if (uVar4 == 0) goto LAB_008104ba;
LAB_00810339:
      pDVar11 = cuddDynamicAllocNode(table);
      pDVar12 = pDVar10;
      if (pDVar11 == (DdNode *)0x0) goto LAB_008104ba;
      pDVar11->index = DVar15;
      DVar19 = local_a4;
      local_a4 = DVar18;
      DVar18 = DVar15;
    }
    else {
      uVar4 = cuddZddSwapInPlace(table,DVar15,DVar18);
      if (DVar15 == x) {
        pDVar10 = pDVar11;
        if (uVar4 != 0) goto LAB_00810339;
        goto LAB_008104ba;
      }
      if ((uVar4 == 0) || (pDVar10 = cuddDynamicAllocNode(table), pDVar10 == (DdNode *)0x0))
      goto LAB_008104ba;
      pDVar10->index = DVar15;
      pDVar10->ref = DVar18;
      *(uint *)((long)&pDVar10->next + 4) = uVar4;
      (pDVar10->type).kids.T = pDVar11;
      uVar4 = cuddZddSwapInPlace(table,x,local_a4);
      pDVar12 = pDVar10;
      if ((uVar4 == 0) || (pDVar11 = cuddDynamicAllocNode(table), pDVar11 == (DdNode *)0x0))
      goto LAB_008104ba;
      pDVar11->index = x;
      DVar19 = DVar18;
      DVar18 = x;
    }
    pDVar11->ref = local_a4;
    *(uint *)((long)&pDVar11->next + 4) = uVar4;
    (pDVar11->type).kids.T = pDVar10;
    x = DVar18 - 1;
    if (((int)DVar1 <= (int)DVar19) ||
       ((double)(int)local_84 * table->maxGrowth < (double)(int)uVar4)) break;
    DVar15 = DVar19;
    local_a4 = DVar18;
    if ((int)uVar4 < (int)local_84) {
      local_84 = uVar4;
    }
  } while( true );
  if ((int)DVar17 < (int)DVar18) {
    iVar3 = cuddZddSwapInPlace(table,x,DVar18);
    pDVar12 = pDVar11;
    if ((iVar3 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0)) {
LAB_008104ba:
      if (pDVar12 != (DdNode *)0x0) {
        pDVar11 = table->nextFree;
        do {
          pDVar9 = pDVar12;
          pDVar12 = (pDVar9->type).kids.T;
          pDVar9->ref = 0;
          pDVar9->next = pDVar11;
          pDVar11 = pDVar9;
        } while (pDVar12 != (DdNode *)0x0);
        table->nextFree = pDVar9;
      }
      pDVar11 = (DdNode *)0x0;
    }
    else {
      pDVar9->index = x;
      pDVar9->ref = DVar18;
      *(int *)((long)&pDVar9->next + 4) = iVar3;
      (pDVar9->type).kids.T = pDVar11;
      pDVar11 = pDVar9;
    }
  }
  if (pDVar11 == (DdNode *)0x0) {
    return 0;
  }
  iVar3 = cuddZddSiftingBackward(table,(Move *)pDVar11,uVar14);
  if (iVar3 == 0) {
    pDVar12 = table->nextFree;
    do {
      pDVar9 = pDVar11;
      pDVar11 = (pDVar9->type).kids.T;
      pDVar9->ref = 0;
      pDVar9->next = pDVar12;
      pDVar12 = pDVar9;
    } while (pDVar11 != (DdNode *)0x0);
    table->nextFree = pDVar9;
    return 0;
  }
  pDVar12 = table->nextFree;
  do {
    pDVar9 = pDVar11;
    pDVar11 = (pDVar9->type).kids.T;
    pDVar9->ref = 0;
    pDVar9->next = pDVar12;
    pDVar12 = pDVar9;
  } while (pDVar11 != (DdNode *)0x0);
  table->nextFree = pDVar9;
  bVar20 = iVar2 == iVar13;
  iVar2 = iVar2 + 1;
  if (bVar20) {
    return 1;
  }
  goto LAB_00810174;
}

Assistant:

int
cuddZddSwapping(
  DdManager * table,
  int lower,
  int upper,
  Cudd_ReorderingType heuristic)
{
    int i, j;
    int max, keys;
    int nvars;
    int x, y;
    int iterate;
    int previousSize;
    Move *moves, *move;
    int pivot = -1;
    int modulo;
    int result;

#ifdef DD_DEBUG
    /* Sanity check */
    assert(lower >= 0 && upper < table->sizeZ && lower <= upper);
#endif

    nvars = upper - lower + 1;
    iterate = nvars;

    for (i = 0; i < iterate; i++) {
        if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
            /* Find pivot <= id with maximum keys. */
            for (max = -1, j = lower; j <= upper; j++) {
                if ((keys = table->subtableZ[j].keys) > max) {
                    max = keys;
                    pivot = j;
                }
            }

            modulo = upper - pivot;
            if (modulo == 0) {
                y = pivot;      /* y = nvars-1 */
            } else {
                /* y = random # from {pivot+1 .. nvars-1} */
                y = pivot + 1 + (int) (Cudd_Random() % modulo);
            }

            modulo = pivot - lower - 1;
            if (modulo < 1) {   /* if pivot = 1 or 0 */
                x = lower;
            } else {
                do { /* x = random # from {0 .. pivot-2} */
                    x = (int) Cudd_Random() % modulo;
                } while (x == y);
                  /* Is this condition really needed, since x and y
                     are in regions separated by pivot? */
            }
        } else {
            x = (int) (Cudd_Random() % nvars) + lower;
            do {
                y = (int) (Cudd_Random() % nvars) + lower;
            } while (x == y);
        }

        previousSize = table->keysZ;
        moves = zddSwapAny(table, x, y);
        if (moves == NULL)
            goto cuddZddSwappingOutOfMem;

        result = cuddZddSiftingBackward(table, moves, previousSize);
        if (!result)
            goto cuddZddSwappingOutOfMem;

        while (moves != NULL) {
            move = moves->next;
            cuddDeallocMove(table, moves);
            moves = move;
        }
#ifdef DD_STATS
        if (table->keysZ < (unsigned) previousSize) {
            (void) fprintf(table->out,"-");
        } else if (table->keysZ > (unsigned) previousSize) {
            (void) fprintf(table->out,"+");     /* should never happen */
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    return(1);

cuddZddSwappingOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(0);

}